

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
          (iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  iterator *piVar8;
  node_ptr nVar9;
  stack_entry *psVar10;
  node_ptr nVar11;
  void *extraout_RDX;
  byte key_byte;
  node_ptr node;
  node_type nVar12;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar13;
  find_result fVar14;
  undefined1 local_b0 [8];
  iter_result_opt cnxt;
  undefined1 local_78 [8];
  iter_result_opt nxt;
  art_key_type remaining_key;
  key_prefix_snapshot key_prefix;
  iterator *local_38;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  (this->keybuf_).off = 0;
  *match = false;
  node.tagged_ptr = (this->db_->root).tagged_ptr;
  piVar8 = this;
  if (node.tagged_ptr != 0) {
    cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = &this->stack_;
    nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = search_key.field_0;
    do {
      uVar5 = nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _24_8_;
      pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(node.tagged_ptr & 0xfffffffffffffff8);
      nVar12 = (node_type)node.tagged_ptr & (I256|I48);
      if ((node.tagged_ptr & 7) == 0) {
        nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
        nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_payload._8_8_ = 0;
        local_78 = (undefined1  [8])node.tagged_ptr;
        std::
        deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
        ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
                  ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                    *)cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._24_8_,(iter_result<unodb::detail::node_header> *)local_78);
        iVar7 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                          ((basic_leaf<unsigned_long,_unodb::detail::node_header> *)pbVar13,
                           (void *)search_key.field_0,extraout_RDX);
        if (iVar7 == 0) {
          *match = true;
        }
        else if (fwd) {
          piVar8 = this;
          if (-1 < iVar7) {
LAB_001169b7:
            piVar8 = next(piVar8);
            goto LAB_00116b0e;
          }
        }
        else {
          piVar8 = this;
          if (iVar7 < 1) {
LAB_00116b05:
            piVar8 = prior(piVar8);
            goto LAB_00116b0e;
          }
        }
        bVar1 = false;
        local_38 = this;
      }
      else {
        remaining_key.field_0.key_bytes._M_elems =
             *(anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 *)&(pbVar13->k_prefix).f;
        uVar4 = remaining_key.field_0.key_bytes._M_elems[7];
        uVar6 = detail::key_prefix_snapshot::get_shared_length
                          ((key_prefix_snapshot *)&remaining_key,
                           nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                           ._24_8_);
        if (uVar6 < (byte)uVar4) {
          if (7 < uVar6) {
            __assert_fail("index < sizeof(KeyType)",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                          ,0x90,
                          "auto unodb::detail::basic_art_key<unsigned long>::operator[](std::size_t) const [KeyType = unsigned long]"
                         );
          }
          if (remaining_key.field_0.key_bytes._M_elems[7] <= uVar6) {
            __assert_fail("i < length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x248,
                          "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
          }
          bVar1 = (&nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                    ._M_engaged)[uVar6];
          bVar2 = *(byte *)((long)&remaining_key.field_0 + (ulong)uVar6);
          if (bVar1 == (bool)bVar2) {
            __assert_fail("cmp_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                          ,0x4ce,
                          "typename db<Key, Value>::iterator &unodb::db<unsigned long, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                         );
          }
          if (fwd) {
            nVar9.tagged_ptr = node.tagged_ptr;
            if (bVar2 <= bVar1) {
              piVar8 = right_most_traversal(this,node);
              goto LAB_001169b7;
            }
LAB_00116aa5:
            piVar8 = left_most_traversal(this,nVar9);
          }
          else {
            nVar9.tagged_ptr = node.tagged_ptr;
            if (bVar1 < bVar2) {
              piVar8 = left_most_traversal(this,node);
              goto LAB_00116b05;
            }
LAB_00116afb:
            piVar8 = right_most_traversal(this,nVar9);
          }
        }
        else {
          if (8 < (byte)uVar4) {
            __assert_fail("num_bytes <= sizeof(KeyType)",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                          ,0xc3,
                          "void unodb::detail::basic_art_key<unsigned long>::shift_right(const std::size_t) [KeyType = unsigned long]"
                         );
          }
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
          _24_8_ = (ulong)uVar5 >> ((uVar4 & 7) << 3);
          key_byte = (byte)nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                           ._24_8_;
          fVar14 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::find_child(pbVar13,nVar12,key_byte);
          if (fVar14.second !=
              (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
               *)0x0) {
            push(this,node,key_byte,fVar14.first,(key_prefix_snapshot)remaining_key.field_0);
            node.tagged_ptr = ((fVar14.second)->value).tagged_ptr;
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _24_8_ = (ulong)nxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                            ._24_8_ >> 8;
            bVar1 = true;
            goto LAB_00116b10;
          }
          if (fwd) {
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::gte_key_byte((iter_result_opt *)local_78,pbVar13,nVar12,key_byte);
            if (nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ != '\0') {
              uVar4 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              nVar9.tagged_ptr =
                   (uintptr_t)
                   detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::get_child(pbVar13,nVar12,
                               nxt.
                               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                               ._M_payload._M_value.node.tagged_ptr._1_1_);
              push(this,node,
                   nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                   ._M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
                   (key_prefix_snapshot)
                   nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                   ._M_payload._8_8_);
              goto LAB_00116aa5;
            }
            if ((this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pop(this);
            }
            do {
              piVar8 = this;
              if ((this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  (this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
              psVar10 = top(this);
              uVar3 = (psVar10->node).tagged_ptr;
              pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         *)(uVar3 & 0xfffffffffffffff8);
              nVar12 = (node_type)uVar3;
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::next((iter_result_opt *)local_b0,pbVar13,nVar12 & (I256|I48),psVar10->child_index);
              uVar4 = cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._16_1_;
              if (cnxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\x01') {
                nVar11 = detail::
                         basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         ::get_child(pbVar13,nVar12 & (I256|I48),psVar10->child_index);
                local_38 = left_most_traversal(this,(node_ptr)nVar11.tagged_ptr);
              }
              else {
                pop(this);
              }
              piVar8 = local_38;
            } while (uVar4 == '\0');
          }
          else {
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
            ::lte_key_byte((iter_result_opt *)local_78,pbVar13,nVar12,key_byte);
            if (nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._M_payload._16_1_ != '\0') {
              uVar4 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              nVar9.tagged_ptr =
                   (uintptr_t)
                   detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::get_child(pbVar13,nVar12,
                               nxt.
                               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                               ._M_payload._M_value.node.tagged_ptr._1_1_);
              push(this,node,
                   nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                   ._M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
                   (key_prefix_snapshot)
                   nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                   ._M_payload._8_8_);
              goto LAB_00116afb;
            }
            if ((this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                (this->stack_).c.
                super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              pop(this);
            }
            do {
              piVar8 = this;
              if ((this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  (this->stack_).c.
                  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
              psVar10 = top(this);
              uVar3 = (psVar10->node).tagged_ptr;
              pbVar13 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         *)(uVar3 & 0xfffffffffffffff8);
              nVar12 = (node_type)uVar3;
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::prior((iter_result_opt *)local_b0,pbVar13,nVar12 & (I256|I48),psVar10->child_index);
              uVar4 = cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._16_1_;
              if (cnxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\x01') {
                nVar11 = detail::
                         basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                         ::get_child(pbVar13,nVar12 & (I256|I48),psVar10->child_index);
                local_38 = right_most_traversal(this,(node_ptr)nVar11.tagged_ptr);
              }
              else {
                pop(this);
              }
              piVar8 = local_38;
            } while (uVar4 == '\0');
          }
        }
LAB_00116b0e:
        local_38 = piVar8;
        bVar1 = false;
      }
LAB_00116b10:
      piVar8 = local_38;
    } while (bVar1);
  }
  return piVar8;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}